

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

bool __thiscall cppcms::widgets::select_multiple::validate(select_multiple *this)

{
  size_type sVar1;
  reference pvVar2;
  base_widget *in_RDI;
  uint i;
  uint count;
  uint local_18;
  uint local_14;
  bool local_1;
  
  local_14 = 0;
  local_18 = 0;
  while( true ) {
    sVar1 = std::
            vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
            ::size((vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                    *)&in_RDI[1].id_);
    if (sVar1 <= local_18) break;
    pvVar2 = std::
             vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
             ::operator[]((vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                           *)&in_RDI[1].id_,(ulong)local_18);
    local_14 = (*(uint *)pvVar2 & 1) + local_14;
    local_18 = local_18 + 1;
  }
  if ((local_14 < *(uint *)((long)&in_RDI[1].id_.field_2 + 8)) ||
     (*(uint *)((long)&in_RDI[1].id_.field_2 + 0xc) < local_14)) {
    base_widget::valid(in_RDI,false);
    local_1 = false;
  }
  else {
    base_widget::valid(in_RDI,true);
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool select_multiple::validate()
{
	unsigned count=0;
	for(unsigned i=0;i<elements_.size();i++)
		count += elements_[i].selected;
	if(low_ <= count && count <= high_) {
		valid(true);
		return true;
	}
	else {
		valid(false);
		return false;
	}
}